

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_openMagicStream(PHYSFS_File *handle)

{
  PHYSFS_ErrorCode errcode;
  
  if (magicStream == (FileHandle *)0x0) {
    if ((handle != (PHYSFS_File *)0x0) && (*(char *)&handle[1].opaque != '\0')) {
      magicStream = (FileHandle *)handle;
      return 1;
    }
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    errcode = PHYSFS_ERR_FILES_STILL_OPEN;
  }
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

int PHYSFS_openMagicStream(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *)handle;
    BAIL_IF(magicStream != NULL, PHYSFS_ERR_FILES_STILL_OPEN, 0);
    BAIL_IF(!handle, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!fh->forReading, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    magicStream = fh;
    return 1;
}